

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dict.c
# Opt level: O2

void lydict_init(ly_dict *dict)

{
  ly_ht *plVar1;
  
  if (dict == (ly_dict *)0x0) {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).","dict","lydict_init");
    return;
  }
  plVar1 = lyht_new(0x400,0x10,lydict_val_eq,(void *)0x0,1);
  dict->hash_tab = plVar1;
  if (plVar1 != (ly_ht *)0x0) {
    pthread_mutex_init((pthread_mutex_t *)&dict->lock,(pthread_mutexattr_t *)0x0);
    return;
  }
  ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
         "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/dict.c",0x40);
  return;
}

Assistant:

void
lydict_init(struct ly_dict *dict)
{
    LY_CHECK_ARG_RET(NULL, dict, );

    dict->hash_tab = lyht_new(LYDICT_MIN_SIZE, sizeof(struct ly_dict_rec), lydict_val_eq, NULL, 1);
    LY_CHECK_ERR_RET(!dict->hash_tab, LOGINT(NULL), );
    pthread_mutex_init(&dict->lock, NULL);
}